

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O0

void * metacall_value_cast_class(void **v)

{
  type_id tVar1;
  klass pcVar2;
  undefined8 *in_RDI;
  value unaff_retaddr;
  value v_cast;
  type_id in_stack_00000064;
  value in_stack_00000068;
  value in_stack_fffffffffffffff0;
  
  tVar1 = value_type_id(unaff_retaddr);
  if ((tVar1 != 0xf) &&
     (in_stack_fffffffffffffff0 = value_type_cast(in_stack_00000068,in_stack_00000064),
     in_stack_fffffffffffffff0 != (value)0x0)) {
    *in_RDI = in_stack_fffffffffffffff0;
  }
  pcVar2 = value_to_class(in_stack_fffffffffffffff0);
  return pcVar2;
}

Assistant:

void *metacall_value_cast_class(void **v)
{
	if (value_type_id(*v) != TYPE_CLASS)
	{
		value v_cast = value_type_cast(*v, TYPE_CLASS);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_class(*v);
}